

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_by_value.cpp
# Opt level: O2

void h(int *i,int s)

{
  long lVar1;
  ostream *poVar2;
  
  spin_mutex_t::lock(&my_io_mutex);
  std::operator<<((ostream *)&std::cerr,"h begin: ");
  lVar1 = std::chrono::_V2::system_clock::now();
  poVar2 = std::ostream::_M_insert<double>((double)(lVar1 - (long)t0.__d.__r) / 1000000000.0);
  poVar2 = std::operator<<(poVar2," with i=");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*i);
  poVar2 = std::operator<<(poVar2," s=");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,s);
  std::endl<char,std::char_traits<char>>(poVar2);
  my_io_mutex.lock_.super___atomic_flag_base._M_i = (atomic_flag)(__atomic_flag_base)0x0;
  *i = *i + s;
  spin_mutex_t::lock(&my_io_mutex);
  std::operator<<((ostream *)&std::cerr,"h finish: ");
  lVar1 = std::chrono::_V2::system_clock::now();
  poVar2 = std::ostream::_M_insert<double>((double)(lVar1 - (long)t0.__d.__r) / 1000000000.0);
  poVar2 = std::operator<<(poVar2," with i=");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*i);
  std::endl<char,std::char_traits<char>>(poVar2);
  my_io_mutex.lock_.super___atomic_flag_base._M_i = (atomic_flag)(__atomic_flag_base)0x0;
  return;
}

Assistant:

void h(int &i, int s) {
  LOG("h begin: " << std::chrono::duration<double>(std::chrono::high_resolution_clock::now() - t0).count() << " with i=" << i << " s=" << s );
  
  i += s;  
  
  LOG("h finish: " << std::chrono::duration<double>(std::chrono::high_resolution_clock::now() - t0).count() << " with i=" << i);
}